

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O3

void spill(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           *graph,stack<StackEntry,_std::deque<StackEntry,_std::allocator<StackEntry>_>_> *tempStack
          ,RegisterInfo *registerInfo,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *originalTemps)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  int iVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vertex;
  StackEntry local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  
  p_Var1 = &(graph->_M_t)._M_impl.super__Rb_tree_header;
  do {
    if ((graph->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
      return;
    }
    bVar2 = checkSimplifiableVertex
                      (graph,(int)((ulong)((long)(registerInfo->registers).
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(registerInfo->registers).
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 5));
    if (bVar2) {
      return;
    }
    p_Var4 = (graph->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var4 == p_Var1) break;
    iVar5 = 0;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pair(&local_80,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(p_Var4 + 1));
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&originalTemps->_M_t,&local_80.first);
      if ((_Rb_tree_header *)iVar3._M_node != &(originalTemps->_M_t)._M_impl.super__Rb_tree_header)
      {
        local_a8.temp._M_dataplus._M_p = (pointer)&local_a8.temp.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,local_80.first._M_dataplus._M_p,
                   local_80.first._M_dataplus._M_p + local_80.first._M_string_length);
        local_a8.isSpilled = true;
        std::deque<StackEntry,_std::allocator<StackEntry>_>::emplace_back<StackEntry>
                  (&tempStack->c,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8.temp._M_dataplus._M_p != &local_a8.temp.field_2) {
          operator_delete(local_a8.temp._M_dataplus._M_p);
        }
        deleteVertexFromGraph(&local_80.first,graph);
        iVar5 = iVar5 + 1;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_80.second._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
        operator_delete(local_80.first._M_dataplus._M_p);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  } while (iVar5 != 0);
  __assert_fail("t != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/register_allocation/RegisterAllocation.cpp"
                ,0x54,
                "void spill(std::map<std::string, std::set<std::string>> &, std::stack<StackEntry> &, AssemblyCode::RegisterInfo &, std::set<std::string> &)"
               );
}

Assistant:

void spill(std::map<std::string, std::set<std::string>>& graph,
           std::stack<StackEntry>& tempStack, AssemblyCode::RegisterInfo& registerInfo, std::set<std::string>& originalTemps) {

    while (!isGraphEmpty(graph) && !checkSimplifiableVertex(graph, registerInfo.registers.size())) {
        int t = 0;
        for (auto vertex : graph) {
            if (originalTemps.find(vertex.first) != originalTemps.end()) {
                ++t;
                tempStack.push( StackEntry( vertex.first, true ));
                deleteVertexFromGraph( vertex.first, graph );
            }
        }

        assert(t != 0);
    }
}